

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

ItemFlags __thiscall QStandardItem::flags(QStandardItem *this)

{
  bool bVar1;
  int value;
  long *in_RDI;
  long in_FS_OFFSET;
  QVariant v;
  undefined4 in_stack_ffffffffffffffa8;
  ItemFlag in_stack_ffffffffffffffac;
  enum_type in_stack_ffffffffffffffb0;
  QFlag in_stack_ffffffffffffffb4;
  QFlag local_3c;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_38;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_34;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_30;
  QFlagsStorage<Qt::ItemFlag> local_2c;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RDI + 0x10))(&local_28,in_RDI,0xff);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0));
  if (bVar1) {
    value = ::QVariant::toInt((bool *)local_28.data);
    QFlag::QFlag(&local_3c,value);
    QFlags<Qt::ItemFlag>::QFlagsStorageHelper
              ((QFlags<Qt::ItemFlag> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
               ,in_stack_ffffffffffffffb4);
  }
  else {
    local_38.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         Qt::operator|(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0);
    local_34.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator|
                   ((QFlags<Qt::ItemFlag> *)
                    CONCAT44(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    local_30.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator|
                   ((QFlags<Qt::ItemFlag> *)
                    CONCAT44(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    local_2c.i = (Int)QFlags<Qt::ItemFlag>::operator|
                                ((QFlags<Qt::ItemFlag> *)
                                 CONCAT44(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0),
                                 in_stack_ffffffffffffffac);
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)local_2c.i;
  }
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QStandardItem::flags() const
{
    QVariant v = data(DataFlagsRole);
    if (!v.isValid())
        return (Qt::ItemIsSelectable|Qt::ItemIsEnabled|Qt::ItemIsEditable
                |Qt::ItemIsDragEnabled|Qt::ItemIsDropEnabled);
    return Qt::ItemFlags(v.toInt());
}